

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::TextureQueryInstance::setupDefaultInputs(TextureQueryInstance *this)

{
  float positions [16];
  
  positions._48_8_ = &DAT_3f8000003f800000;
  positions[0xe] = 0.0;
  positions[0xf] = 1.0;
  positions[8] = 1.0;
  positions[9] = -1.0;
  positions[10] = 0.0;
  positions[0xb] = 1.0;
  positions[4] = -1.0;
  positions[5] = 1.0;
  positions[6] = 0.0;
  positions[7] = 1.0;
  positions[0] = -1.0;
  positions[1] = -1.0;
  positions[2] = 0.0;
  positions[3] = 1.0;
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,4,positions)
  ;
  return;
}

Assistant:

void TextureQueryInstance::setupDefaultInputs (void)
{
	const deUint32		numVertices		= 4;
	const float			positions[]		=
	{
		-1.0f, -1.0f, 0.0f, 1.0f,
		-1.0f,  1.0f, 0.0f, 1.0f,
		 1.0f, -1.0f, 0.0f, 1.0f,
		 1.0f,  1.0f, 0.0f, 1.0f
	};

	addAttribute(0u, vk::VK_FORMAT_R32G32B32A32_SFLOAT, 4 * (deUint32)sizeof(float), numVertices, positions);
}